

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3WhereRealloc(WhereInfo *pWInfo,void *pOld,u64 nByte)

{
  void *__dest;
  WhereMemBlock *pOldBlk;
  void *pNew;
  u64 nByte_local;
  void *pOld_local;
  WhereInfo *pWInfo_local;
  
  __dest = sqlite3WhereMalloc(pWInfo,nByte);
  if ((__dest != (void *)0x0) && (pOld != (void *)0x0)) {
    memcpy(__dest,pOld,*(size_t *)((long)pOld + -8));
  }
  return __dest;
}

Assistant:

SQLITE_PRIVATE void *sqlite3WhereRealloc(WhereInfo *pWInfo, void *pOld, u64 nByte){
  void *pNew = sqlite3WhereMalloc(pWInfo, nByte);
  if( pNew && pOld ){
    WhereMemBlock *pOldBlk = (WhereMemBlock*)pOld;
    pOldBlk--;
    assert( pOldBlk->sz<nByte );
    memcpy(pNew, pOld, pOldBlk->sz);
  }
  return pNew;
}